

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

UnlocalizedNumberFormatter *
icu_63::number::impl::skeleton::create
          (UnlocalizedNumberFormatter *__return_storage_ptr__,UnicodeString *skeletonString,
          UErrorCode *status)

{
  MacroProps macros;
  MacroProps local_3a0;
  MacroProps local_1e0;
  
  umtx_initOnce((UInitOnce *)&::(anonymous_namespace)::gNumberSkeletonsInitOnce,
                anon_unknown.dwarf_1a1818::initNumberSkeletons,status);
  parseSkeleton(&local_3a0,skeletonString,status);
  NumberFormatter::with();
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::macros
            (__return_storage_ptr__,
             (NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter> *)&local_1e0,
             &local_3a0);
  MacroProps::~MacroProps(&local_1e0);
  MacroProps::~MacroProps(&local_3a0);
  return __return_storage_ptr__;
}

Assistant:

UnlocalizedNumberFormatter skeleton::create(const UnicodeString& skeletonString, UErrorCode& status) {
    umtx_initOnce(gNumberSkeletonsInitOnce, &initNumberSkeletons, status);
    MacroProps macros = parseSkeleton(skeletonString, status);
    return NumberFormatter::with().macros(macros);
}